

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_cipher.c
# Opt level: O1

int gost_grasshopper_cipher_do_ctracpkm_omac(EVP_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t inl)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  lVar3 = EVP_CIPHER_CTX_get_cipher_data();
  iVar1 = EVP_CIPHER_CTX_is_encrypting(ctx);
  if (iVar1 != 0) {
    EVP_DigestSignUpdate(*(undefined8 *)(lVar3 + 0x1c8),in,inl);
  }
  if (in == (uchar *)0x0 && inl == 0) {
    iVar1 = gost2015_final_call(ctx,*(EVP_MD_CTX **)(lVar3 + 0x1c8),0x10,(uchar *)(lVar3 + 0x1b4),
                                gost_grasshopper_cipher_do_ctracpkm);
    return iVar1;
  }
  if (in == (uchar *)0x0) {
    ERR_GOST_error(0xa0,0x80006,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/gost_grasshopper_cipher.c"
                   ,0x2e2);
    iVar1 = -1;
  }
  else {
    iVar1 = gost_grasshopper_cipher_do_ctracpkm(ctx,out,in,inl);
    iVar2 = EVP_CIPHER_CTX_is_encrypting(ctx);
    if (iVar2 == 0) {
      EVP_DigestSignUpdate(*(undefined8 *)(lVar3 + 0x1c8),out,inl);
    }
  }
  return iVar1;
}

Assistant:

static int gost_grasshopper_cipher_do_ctracpkm_omac(EVP_CIPHER_CTX *ctx,
                                                    unsigned char *out,
                                                    const unsigned char *in,
                                                    size_t inl)
{
    int result;
    gost_grasshopper_cipher_ctx_ctr *c = EVP_CIPHER_CTX_get_cipher_data(ctx);
    /* As in and out can be the same pointer, process unencrypted here */
    if (EVP_CIPHER_CTX_encrypting(ctx))
        EVP_DigestSignUpdate(c->omac_ctx, in, inl);

    if (in == NULL && inl == 0) { /* Final call */
        return gost2015_final_call(ctx, c->omac_ctx, KUZNYECHIK_MAC_MAX_SIZE, c->tag, gost_grasshopper_cipher_do_ctracpkm);
    }

    if (in == NULL) {
        GOSTerr(GOST_F_GOST_GRASSHOPPER_CIPHER_DO_CTRACPKM_OMAC, ERR_R_EVP_LIB);
        return -1;
    }
    result = gost_grasshopper_cipher_do_ctracpkm(ctx, out, in, inl);

    /* As in and out can be the same pointer, process decrypted here */
    if (!EVP_CIPHER_CTX_encrypting(ctx))
        EVP_DigestSignUpdate(c->omac_ctx, out, inl);

    return result;
}